

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::trivialHeuristic(SPxMainSM<double> *this,SPxLPBase<double> *lp)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  double dVar2;
  Nonzero<double> *pNVar3;
  pointer pdVar4;
  double dVar5;
  Real RVar6;
  Real RVar7;
  bool bVar8;
  double *pdVar9;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar10;
  VectorBase<double> *pVVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  Item *pIVar15;
  ulong uVar16;
  undefined4 uVar17;
  uint uVar18;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  double dVar19;
  double local_1f0;
  double local_1e8;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_1c8;
  uint local_1b4;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  ulong local_190;
  VectorBase<double> downLocks;
  VectorBase<double> upLocks;
  undefined8 local_158;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_138;
  VectorBase<double> locksol;
  VectorBase<double> uppersol;
  VectorBase<double> lowersol;
  VectorBase<double> zerosol;
  _Vector_base<double,_std::allocator<double>_> local_c8;
  _Vector_base<double,_std::allocator<double>_> local_b0;
  _Vector_base<double,_std::allocator<double>_> local_98;
  _Vector_base<double,_std::allocator<double>_> local_80;
  undefined4 local_68;
  uint uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_58 [16];
  double local_48;
  undefined8 uStack_40;
  
  VectorBase<double>::VectorBase
            (&zerosol,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  VectorBase<double>::VectorBase
            (&lowersol,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  VectorBase<double>::VectorBase
            (&uppersol,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  VectorBase<double>::VectorBase
            (&locksol,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  VectorBase<double>::VectorBase
            (&upLocks,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  VectorBase<double>::VectorBase
            (&downLocks,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  local_198 = (this->super_SPxSimplifier<double>).m_objoffset;
  pdVar9 = (double *)infinity();
  local_158 = *pdVar9;
  dVar5 = feastol(this);
  pdVar9 = (double *)infinity();
  dVar19 = *pdVar9;
  psVar1 = &(this->super_SPxSimplifier<double>)._tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1c8,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)
  ;
  RVar6 = Tolerances::epsilon(local_1c8._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8._M_refcount);
  uVar10 = extraout_RAX;
  if (1.0 / dVar5 - dVar19 < -RVar6) {
    local_158 = feastol(this);
    local_158 = 1.0 / local_158;
    uVar10 = extraout_RAX_00;
  }
  uVar12 = (ulong)(uint)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  uStack_64 = local_158._4_4_ ^ 0x80000000;
  uStack_5c = 0x80000000;
  local_68 = (undefined4)local_158;
  uStack_60 = 0;
  local_1b4 = (uint)CONCAT71((int7)((ulong)uVar10 >> 8),1);
  local_1a0 = local_198;
  local_1b0 = local_198;
  local_1a8 = local_198;
  do {
    if ((int)uVar12 < 1) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_80,&lowersol.val);
      bVar8 = checkSolution(this,lp,(VectorBase<double> *)&local_80);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_80);
      if ((bVar8) && (this->m_cutoffbound <= local_1a0 && local_1a0 != this->m_cutoffbound)) {
        this->m_cutoffbound = local_1a0;
      }
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_98,&uppersol.val);
      bVar8 = checkSolution(this,lp,(VectorBase<double> *)&local_98);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_98);
      if ((bVar8) && (this->m_cutoffbound <= local_1b0 && local_1b0 != this->m_cutoffbound)) {
        this->m_cutoffbound = local_1b0;
      }
      if ((local_1b4 & 1) != 0) {
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&local_b0,&zerosol.val);
        bVar8 = checkSolution(this,lp,(VectorBase<double> *)&local_b0);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_b0);
        if ((bVar8) && (this->m_cutoffbound <= local_198 && local_198 != this->m_cutoffbound)) {
          this->m_cutoffbound = local_198;
        }
      }
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_c8,&locksol.val);
      bVar8 = checkSolution(this,lp,(VectorBase<double> *)&local_c8);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_c8);
      if ((bVar8) && (this->m_cutoffbound <= local_1a8 && local_1a8 != this->m_cutoffbound)) {
        this->m_cutoffbound = local_1a8;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&downLocks);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&upLocks);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&locksol);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&uppersol);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&lowersol);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&zerosol);
      return;
    }
    local_190 = uVar12 - 1;
    upLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[local_190] = 0.0;
    downLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[local_190] = 0.0;
    pIVar15 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
              (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[local_190].idx;
    lVar14 = 8;
    for (lVar13 = 0; uVar12 = local_190, lVar13 < (pIVar15->data).super_SVectorBase<double>.memused;
        lVar13 = lVar13 + 1) {
      pNVar3 = (pIVar15->data).super_SVectorBase<double>.m_elem;
      dVar19 = *(double *)((long)pNVar3 + lVar14 + -8);
      dVar5 = (lp->super_LPRowSetBase<double>).left.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[*(int *)((long)&pNVar3->val + lVar14)];
      pdVar9 = (double *)infinity();
      dVar2 = *pdVar9;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1c8,
                 &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar6 = Tolerances::epsilon(local_1c8._M_ptr);
      if (dVar5 + dVar2 <= RVar6) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8._M_refcount);
LAB_001eacbd:
        dVar5 = (lp->super_LPRowSetBase<double>).left.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[*(int *)((long)&((pIVar15->data).super_SVectorBase<double>.m_elem)->val +
                                 lVar14)];
        pdVar9 = (double *)infinity();
        dVar2 = *pdVar9;
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1c8,
                   &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar6 = Tolerances::epsilon(local_1c8._M_ptr);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8._M_refcount);
        if (RVar6 < dVar5 + dVar2) {
          pVVar11 = &downLocks;
          if (dVar19 <= 0.0) {
            pVVar11 = &upLocks;
joined_r0x001eadf7:
            if (0.0 <= dVar19) goto LAB_001eae13;
          }
          goto LAB_001eadf9;
        }
        dVar5 = (lp->super_LPRowSetBase<double>).right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[*(int *)((long)&((pIVar15->data).super_SVectorBase<double>.m_elem)->val +
                                 lVar14)];
        pdVar9 = (double *)infinity();
        dVar2 = *pdVar9;
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1c8,
                   &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar6 = Tolerances::epsilon(local_1c8._M_ptr);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8._M_refcount);
        if (dVar5 - dVar2 < -RVar6) {
          pVVar11 = &upLocks;
          if (dVar19 <= 0.0) {
            pVVar11 = &downLocks;
            goto joined_r0x001eadf7;
          }
          goto LAB_001eadf9;
        }
      }
      else {
        dVar5 = (lp->super_LPRowSetBase<double>).right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[*(int *)((long)&((pIVar15->data).super_SVectorBase<double>.m_elem)->val +
                                 lVar14)];
        pdVar9 = (double *)infinity();
        dVar2 = *pdVar9;
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_138,
                   &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar6 = Tolerances::epsilon(local_138._M_ptr);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8._M_refcount);
        if (-RVar6 <= dVar5 - dVar2) goto LAB_001eacbd;
        upLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[local_190] =
             upLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[local_190] + 1.0;
        pVVar11 = &downLocks;
LAB_001eadf9:
        pdVar4 = (pVVar11->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4[local_190] = pdVar4[local_190] + 1.0;
      }
LAB_001eae13:
      lVar14 = lVar14 + 0x10;
    }
    local_48 = (lp->super_LPColSetBase<double>).low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[local_190];
    uStack_40 = 0;
    dVar19 = (lp->super_LPColSetBase<double>).up.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[local_190];
    pdVar9 = (double *)infinity();
    dVar5 = *pdVar9;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1c8,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar6 = Tolerances::epsilon(local_1c8._M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8._M_refcount);
    pdVar9 = (double *)infinity();
    dVar2 = *pdVar9;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1c8,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar7 = Tolerances::epsilon(local_1c8._M_ptr);
    local_58._8_4_ = extraout_XMM0_Dc;
    local_58._0_8_ = -RVar7;
    local_58._12_4_ = extraout_XMM0_Dd ^ 0x80000000;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8._M_refcount);
    local_1f0 = dVar19;
    if ((double)local_58._0_8_ < dVar19 - dVar2) {
      dVar2 = (lp->super_LPColSetBase<double>).low.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar12];
      local_1f0 = local_158;
      if (local_158 < dVar2) {
        local_1f0 = dVar2;
      }
    }
    uVar17 = local_68;
    uVar18 = uStack_64;
    if (dVar19 <= (double)CONCAT44(uStack_64,local_68)) {
      uVar17 = SUB84(dVar19,0);
      uVar18 = (uint)((ulong)dVar19 >> 0x20);
    }
    uVar16 = -(ulong)(dVar5 + local_48 < RVar6);
    local_1e8 = (double)(~uVar16 & (ulong)local_48 | CONCAT44(uVar18,uVar17) & uVar16);
    if ((local_1b4 & 1) != 0) {
      dVar19 = feastol(this);
      if ((dVar19 <= local_1e8) || (dVar19 = feastol(this), local_1f0 <= -dVar19)) {
        local_1b4 = 0;
      }
      else {
        zerosol.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar12] = 0.0;
      }
    }
    lowersol.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start[uVar12] = local_1e8;
    uppersol.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start[uVar12] = local_1f0;
    dVar19 = local_1f0;
    if ((downLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar12] <=
         upLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar12]) &&
       (dVar19 = local_1e8,
       upLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[uVar12] <=
       downLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[uVar12])) {
      dVar19 = (local_1e8 + local_1f0) * 0.5;
    }
    locksol.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar12] = dVar19;
    dVar5 = (lp->super_LPColSetBase<double>).object.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar12];
    local_1a0 = local_1a0 +
                lowersol.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12] * dVar5;
    local_1b0 = local_1b0 +
                uppersol.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12] * dVar5;
    local_1a8 = local_1a8 + dVar5 * dVar19;
  } while( true );
}

Assistant:

void SPxMainSM<R>::trivialHeuristic(SPxLPBase<R>& lp)
{
   VectorBase<R>         zerosol(lp.nCols());  // the zero solution VectorBase<R>
   VectorBase<R>         lowersol(lp.nCols()); // the lower bound solution VectorBase<R>
   VectorBase<R>         uppersol(lp.nCols()); // the upper bound solution VectorBase<R>
   VectorBase<R>         locksol(lp.nCols());  // the locks solution VectorBase<R>

   VectorBase<R>         upLocks(lp.nCols());
   VectorBase<R>         downLocks(lp.nCols());

   R            zeroObj = this->m_objoffset;
   R            lowerObj = this->m_objoffset;
   R            upperObj = this->m_objoffset;
   R            lockObj = this->m_objoffset;

   bool            zerovalid = true;

   R largeValue = R(infinity);

   if(LT(R(1.0 / feastol()), R(infinity), this->tolerances()->epsilon()))
      largeValue = 1.0 / feastol();



   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      upLocks[j] = 0;
      downLocks[j] = 0;

      // computing the locks on the variables
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon())
               && LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      R lower = lp.lower(j);
      R upper = lp.upper(j);

      if(LE(lower, R(-infinity), this->tolerances()->epsilon()))
         lower = SOPLEX_MIN(-largeValue, upper);

      if(GE(upper, R(infinity), this->tolerances()->epsilon()))
         upper = SOPLEX_MAX(lp.lower(j), largeValue);

      if(zerovalid)
      {
         if(LE(lower, R(0.0), feastol()) && GE(upper, R(0.0), feastol()))
            zerosol[j] = 0.0;
         else
            zerovalid = false;
      }

      lowersol[j] = lower;
      uppersol[j] = upper;

      if(downLocks[j] > upLocks[j])
         locksol[j] = upper;
      else if(downLocks[j] < upLocks[j])
         locksol[j] = lower;
      else
         locksol[j] = (lower + upper) / 2.0;

      lowerObj += lp.maxObj(j) * lowersol[j];
      upperObj += lp.maxObj(j) * uppersol[j];
      lockObj += lp.maxObj(j) * locksol[j];
   }

   // trying the lower bound solution
   if(checkSolution(lp, lowersol))
   {
      if(lowerObj > m_cutoffbound)
         m_cutoffbound = lowerObj;
   }

   // trying the upper bound solution
   if(checkSolution(lp, uppersol))
   {
      if(upperObj > m_cutoffbound)
         m_cutoffbound = upperObj;
   }

   // trying the zero solution
   if(zerovalid && checkSolution(lp, zerosol))
   {
      if(zeroObj > m_cutoffbound)
         m_cutoffbound = zeroObj;
   }

   // trying the lock solution
   if(checkSolution(lp, locksol))
   {
      if(lockObj > m_cutoffbound)
         m_cutoffbound = lockObj;
   }
}